

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O2

void print_utf8(unsigned_long val)

{
  ostream *poVar1;
  unsigned_long uVar2;
  unsigned_long in_RDX;
  size_type sVar3;
  int in_R8D;
  bool error;
  size_t pos;
  string utf8;
  string result;
  
  QUtil::toUTF8_abi_cxx11_(&result,(QUtil *)val,in_RDX);
  poVar1 = std::operator<<((ostream *)&std::cout,"0x");
  QUtil::uint_to_string_base_abi_cxx11_(&utf8,(QUtil *)val,0x10,0,in_R8D);
  poVar1 = std::operator<<(poVar1,(string *)&utf8);
  std::operator<<(poVar1," ->");
  std::__cxx11::string::~string((string *)&utf8);
  if (val < 0xfffe) {
    poVar1 = std::operator<<((ostream *)&std::cout," ");
    std::operator<<(poVar1,(string *)&result);
  }
  else {
    for (sVar3 = 0; result._M_string_length != sVar3; sVar3 = sVar3 + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout," ");
      QUtil::int_to_string_base_abi_cxx11_
                (&utf8,(QUtil *)(ulong)(byte)result._M_dataplus._M_p[sVar3],0x10,2,in_R8D);
      std::operator<<(poVar1,(string *)&utf8);
      std::__cxx11::string::~string((string *)&utf8);
    }
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&utf8,anon_var_dwarf_6868,(allocator<char> *)&pos);
  pos = 0;
  error = false;
  uVar2 = QUtil::get_next_utf8_codepoint(&utf8,&pos,&error);
  if (uVar2 != 0x3c0) {
    __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x3c0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xe9,"void print_utf8(unsigned long)");
  }
  if (pos != 2) {
    __assert_fail("pos == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xea,"void print_utf8(unsigned long)");
  }
  if (error == true) {
    __assert_fail("!error",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xeb,"void print_utf8(unsigned long)");
  }
  uVar2 = QUtil::get_next_utf8_codepoint(&utf8,&pos,&error);
  if (uVar2 != 0xfffd) {
    __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0xfffd",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xec,"void print_utf8(unsigned long)");
  }
  if (pos != 3) {
    __assert_fail("pos == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xed,"void print_utf8(unsigned long)");
  }
  if (error == false) {
    __assert_fail("error",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xee,"void print_utf8(unsigned long)");
  }
  uVar2 = QUtil::get_next_utf8_codepoint(&utf8,&pos,&error);
  if (uVar2 != 0x30) {
    __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x30",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xef,"void print_utf8(unsigned long)");
  }
  if (pos != 4) {
    __assert_fail("pos == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf0,"void print_utf8(unsigned long)");
  }
  if (error == true) {
    __assert_fail("!error",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf1,"void print_utf8(unsigned long)");
  }
  uVar2 = QUtil::get_next_utf8_codepoint(&utf8,&pos,&error);
  if (uVar2 != 0xfffd) {
    __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0xfffd",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf2,"void print_utf8(unsigned long)");
  }
  if (pos != 6) {
    __assert_fail("pos == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf3,"void print_utf8(unsigned long)");
  }
  if (error == false) {
    __assert_fail("error",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf4,"void print_utf8(unsigned long)");
  }
  uVar2 = QUtil::get_next_utf8_codepoint(&utf8,&pos,&error);
  if (uVar2 != 0x30) {
    __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x30",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf5,"void print_utf8(unsigned long)");
  }
  if (pos != 7) {
    __assert_fail("pos == 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xf6,"void print_utf8(unsigned long)");
  }
  if (error != true) {
    uVar2 = QUtil::get_next_utf8_codepoint(&utf8,&pos,&error);
    if (uVar2 != 0x31) {
      __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x31",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0xf8,"void print_utf8(unsigned long)");
    }
    if (pos != 8) {
      __assert_fail("pos == 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0xf9,"void print_utf8(unsigned long)");
    }
    if (error == true) {
      __assert_fail("!error",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0xfa,"void print_utf8(unsigned long)");
    }
    uVar2 = QUtil::get_next_utf8_codepoint(&utf8,&pos,&error);
    if (uVar2 == 0xfffd) {
      if (pos != 9) {
        __assert_fail("pos == 9",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                      ,0xfc,"void print_utf8(unsigned long)");
      }
      if (error != false) {
        std::__cxx11::string::~string((string *)&utf8);
        std::__cxx11::string::~string((string *)&result);
        return;
      }
      __assert_fail("error",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                    ,0xfd,"void print_utf8(unsigned long)");
    }
    __assert_fail("QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0xfffd",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                  ,0xfb,"void print_utf8(unsigned long)");
  }
  __assert_fail("!error",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libtests/qutil.cc"
                ,0xf7,"void print_utf8(unsigned long)");
}

Assistant:

static void
print_utf8(unsigned long val)
{
    std::string result = QUtil::toUTF8(val);
    std::cout << "0x" << QUtil::uint_to_string_base(val, 16) << " ->";
    if (val < 0xfffe) {
        std::cout << " " << result;
    } else {
        // Emacs has trouble with utf-8 encoding files with characters
        // outside the 16-bit portion, so just show the character
        // values.
        for (auto const& ch: result) {
            std::cout << " "
                      << QUtil::int_to_string_base(
                             static_cast<int>(static_cast<unsigned char>(ch)), 16, 2);
        }
    }
    std::cout << std::endl;

    // Boundary conditions for QUtil::get_next_utf8_codepoint, which is
    // also tested indirectly through test_pdf_unicode.cc.
    std::string utf8 = "\xcf\x80\xcf\x30\xEF\xBF\x30\x31\xcf";
    size_t pos = 0;
    bool error = false;
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x3c0);
    assert(pos == 2);
    assert(!error);
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0xfffd);
    assert(pos == 3);
    assert(error);
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x30);
    assert(pos == 4);
    assert(!error);
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0xfffd);
    assert(pos == 6);
    assert(error);
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x30);
    assert(pos == 7);
    assert(!error);
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0x31);
    assert(pos == 8);
    assert(!error);
    assert(QUtil::get_next_utf8_codepoint(utf8, pos, error) == 0xfffd);
    assert(pos == 9);
    assert(error);
}